

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgRuleWavelet.cpp
# Opt level: O1

double __thiscall TasGrid::RuleWavelet::eval_cubic<1>(RuleWavelet *this,int point,double x)

{
  double *pdVar1;
  long lVar2;
  pointer pdVar3;
  uint uVar4;
  long lVar5;
  pointer pvVar6;
  int iVar7;
  long lVar8;
  double *pdVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  
  if (((point == 0) && (x == 0.0)) && (!NAN(x))) {
    return 0.0;
  }
  if (point < 5) {
    if (point == 4) {
      point = 3;
    }
    else {
      if (point != 2) {
        dVar14 = 1.0;
        goto LAB_001c444f;
      }
      point = 1;
    }
    x = -x;
    dVar14 = -1.0;
LAB_001c444f:
    pvVar6 = (this->data).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar11 = this->num_data_points;
    iVar10 = -1;
    if ((ABS(x) <= 1.0) && (iVar10 = 0, 2 < iVar11)) {
      iVar7 = iVar11 + -1;
      iVar10 = 0;
      do {
        iVar12 = (iVar10 + iVar7) / 2;
        if (*(double *)
             (*(long *)&(pvVar6->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data + (long)iVar12 * 8) <= x) {
          iVar10 = iVar12;
          iVar12 = iVar7;
        }
        iVar7 = iVar12;
      } while (1 < iVar7 - iVar10);
    }
    if (iVar10 == -1) {
      dVar15 = 0.0;
    }
    else {
      lVar8 = (long)(((point - (point + 1 >> 0x1f)) + 1 >> 1) * iVar11) * 8 +
              *(long *)&pvVar6[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data;
      if (iVar10 < 1) {
        lVar5 = 0;
      }
      else {
        iVar7 = iVar11 + -3;
        if (iVar10 - iVar11 < -2) {
          iVar7 = iVar10;
        }
        lVar5 = (long)(iVar7 + -1);
      }
      lVar2 = *(long *)&(pvVar6->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data;
      dVar16 = x - *(double *)(lVar2 + lVar5 * 8);
      dVar15 = x - *(double *)(lVar2 + 8 + lVar5 * 8);
      dVar17 = x - *(double *)(lVar2 + 0x10 + lVar5 * 8);
      dVar18 = x - *(double *)(lVar2 + 0x18 + lVar5 * 8);
      pdVar3 = (this->cachexs).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      dVar15 = (dVar15 * dVar17 + dVar16 * dVar17 + dVar16 * dVar15) *
               pdVar3[lVar5 * 4 + 3] * *(double *)(lVar8 + 0x18 + lVar5 * 8) +
               (dVar15 * dVar18 + dVar16 * dVar18 + dVar16 * dVar15) *
               pdVar3[lVar5 * 4 + 2] * *(double *)(lVar8 + 0x10 + lVar5 * 8) +
               (dVar18 * dVar17 + dVar16 * dVar18 + dVar16 * dVar17) *
               pdVar3[lVar5 * 4 + 1] * *(double *)(lVar8 + 8 + lVar5 * 8) +
               (dVar18 * dVar17 + dVar15 * dVar18 + dVar15 * dVar17) *
               pdVar3[lVar5 * 4] * *(double *)(lVar8 + lVar5 * 8);
    }
    return dVar14 * dVar15;
  }
  uVar4 = point - 1U;
  iVar11 = -4;
  do {
    iVar10 = iVar11;
    uVar4 = (int)uVar4 >> 1;
    iVar11 = iVar10 + 1;
  } while (1 < uVar4);
  iVar10 = iVar10 + 4;
  if (iVar10 == 2) {
    iVar11 = point;
    dVar14 = x;
    if (0xc < point) {
      iVar11 = 0x19 - point;
      dVar14 = -x;
    }
    pvVar6 = (this->data).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar10 = this->num_data_points;
    iVar7 = -1;
    if ((ABS(x) <= 1.0) && (iVar7 = 0, 2 < iVar10)) {
      iVar12 = iVar10 + -1;
      iVar7 = 0;
      do {
        iVar13 = (iVar7 + iVar12) / 2;
        if (*(double *)
             (*(long *)&(pvVar6->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data + (long)iVar13 * 8) <= dVar14) {
          iVar7 = iVar13;
          iVar13 = iVar12;
        }
        iVar12 = iVar13;
      } while (1 < iVar12 - iVar7);
    }
    if (iVar7 == -1) {
      dVar14 = 0.0;
    }
    else {
      lVar8 = (long)((iVar11 + -9) * iVar10) * 8 +
              *(long *)&pvVar6[3].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data;
      if (iVar7 < 1) {
        lVar5 = 0;
      }
      else {
        iVar11 = iVar10 + -3;
        if (iVar7 - iVar10 < -2) {
          iVar11 = iVar7;
        }
        lVar5 = (long)(iVar11 + -1);
      }
      lVar2 = *(long *)&(pvVar6->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data;
      dVar16 = dVar14 - *(double *)(lVar2 + lVar5 * 8);
      dVar15 = dVar14 - *(double *)(lVar2 + 8 + lVar5 * 8);
      dVar17 = dVar14 - *(double *)(lVar2 + 0x10 + lVar5 * 8);
      dVar14 = dVar14 - *(double *)(lVar2 + 0x18 + lVar5 * 8);
      pdVar3 = (this->cachexs).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      dVar14 = (dVar15 * dVar17 + dVar16 * dVar17 + dVar16 * dVar15) *
               pdVar3[lVar5 * 4 + 3] * *(double *)(lVar8 + 0x18 + lVar5 * 8) +
               (dVar15 * dVar14 + dVar16 * dVar14 + dVar16 * dVar15) *
               pdVar3[lVar5 * 4 + 2] * *(double *)(lVar8 + 0x10 + lVar5 * 8) +
               (dVar14 * dVar17 + dVar16 * dVar14 + dVar16 * dVar17) *
               pdVar3[lVar5 * 4 + 1] * *(double *)(lVar8 + 8 + lVar5 * 8) +
               (dVar14 * dVar17 + dVar15 * dVar14 + dVar15 * dVar17) *
               pdVar3[lVar5 * 4] * *(double *)(lVar8 + lVar5 * 8);
    }
    if (point < 0xd) {
      return dVar14;
    }
LAB_001c4b58:
    return -dVar14;
  }
  if (iVar10 == 1) {
    iVar11 = point;
    dVar14 = x;
    if (6 < point) {
      iVar11 = 0xd - point;
      dVar14 = -x;
    }
    pvVar6 = (this->data).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar10 = this->num_data_points;
    iVar7 = -1;
    if ((ABS(x) <= 1.0) && (iVar7 = 0, 2 < iVar10)) {
      iVar12 = iVar10 + -1;
      iVar7 = 0;
      do {
        iVar13 = (iVar7 + iVar12) / 2;
        if (*(double *)
             (*(long *)&(pvVar6->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data + (long)iVar13 * 8) <= dVar14) {
          iVar7 = iVar13;
          iVar13 = iVar12;
        }
        iVar12 = iVar13;
      } while (1 < iVar12 - iVar7);
    }
    if (iVar7 == -1) {
      dVar14 = 0.0;
    }
    else {
      lVar8 = (long)((iVar11 + -5) * iVar10) * 8 +
              *(long *)&pvVar6[2].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data;
      if (iVar7 < 1) {
        lVar5 = 0;
      }
      else {
        iVar11 = iVar10 + -3;
        if (iVar7 - iVar10 < -2) {
          iVar11 = iVar7;
        }
        lVar5 = (long)(iVar11 + -1);
      }
      lVar2 = *(long *)&(pvVar6->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data;
      dVar16 = dVar14 - *(double *)(lVar2 + lVar5 * 8);
      dVar15 = dVar14 - *(double *)(lVar2 + 8 + lVar5 * 8);
      dVar17 = dVar14 - *(double *)(lVar2 + 0x10 + lVar5 * 8);
      dVar14 = dVar14 - *(double *)(lVar2 + 0x18 + lVar5 * 8);
      pdVar3 = (this->cachexs).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      dVar14 = (dVar15 * dVar17 + dVar16 * dVar17 + dVar16 * dVar15) *
               pdVar3[lVar5 * 4 + 3] * *(double *)(lVar8 + 0x18 + lVar5 * 8) +
               (dVar15 * dVar14 + dVar16 * dVar14 + dVar16 * dVar15) *
               pdVar3[lVar5 * 4 + 2] * *(double *)(lVar8 + 0x10 + lVar5 * 8) +
               (dVar14 * dVar17 + dVar16 * dVar14 + dVar16 * dVar17) *
               pdVar3[lVar5 * 4 + 1] * *(double *)(lVar8 + 8 + lVar5 * 8) +
               (dVar14 * dVar17 + dVar15 * dVar14 + dVar15 * dVar17) *
               pdVar3[lVar5 * 4] * *(double *)(lVar8 + lVar5 * 8);
    }
    if (point < 7) {
      return dVar14;
    }
    goto LAB_001c4b58;
  }
  iVar10 = 2 << ((byte)iVar10 & 0x1f);
  uVar4 = (int)(point - 1U) % iVar10;
  dVar14 = ldexp(1.0,iVar11);
  if ((int)uVar4 < 5) {
    pvVar6 = (this->data).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar11 = this->num_data_points;
    dVar15 = (x + 1.0) * dVar14 + -1.0;
    iVar7 = -1;
    if ((ABS(dVar15) <= 1.0) && (iVar7 = 0, 2 < iVar11)) {
      iVar12 = iVar11 + -1;
      iVar7 = 0;
      do {
        iVar13 = (iVar7 + iVar12) / 2;
        if (*(double *)
             (*(long *)&(pvVar6->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data + (long)iVar13 * 8) <= dVar15) {
          iVar7 = iVar13;
          iVar13 = iVar12;
        }
        iVar12 = iVar13;
      } while (1 < iVar12 - iVar7);
    }
    if (iVar7 != -1) {
      iVar12 = iVar11 * uVar4;
LAB_001c48ab:
      lVar8 = (long)iVar12 * 8 +
              *(long *)&pvVar6[4].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data;
      if (iVar7 < 1) {
LAB_001c4b65:
        lVar5 = 0;
      }
      else {
        iVar12 = iVar11 + -3;
        if (iVar7 - iVar11 < -2) {
          iVar12 = iVar7;
        }
        lVar5 = (long)(iVar12 + -1);
      }
LAB_001c4b67:
      pdVar9 = (double *)
               (lVar5 * 8 +
               *(long *)&(pvVar6->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data);
      pdVar1 = (double *)(lVar8 + lVar5 * 8);
      dVar17 = dVar15 - *pdVar9;
      dVar16 = dVar15 - pdVar9[1];
      dVar18 = dVar15 - pdVar9[2];
      dVar15 = dVar15 - pdVar9[3];
      pdVar3 = (this->cachexs).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      dVar15 = (dVar16 * dVar18 + dVar17 * dVar18 + dVar17 * dVar16) *
               pdVar3[lVar5 * 4 + 3] * pdVar1[3] +
               (dVar16 * dVar15 + dVar17 * dVar15 + dVar17 * dVar16) *
               pdVar3[lVar5 * 4 + 2] * pdVar1[2] +
               (dVar15 * dVar18 + dVar17 * dVar15 + dVar17 * dVar18) *
               pdVar3[lVar5 * 4 + 1] * pdVar1[1] +
               (dVar15 * dVar18 + dVar16 * dVar15 + dVar16 * dVar18) * pdVar3[lVar5 * 4] * *pdVar1;
      goto LAB_001c4c3b;
    }
  }
  else if ((int)(uVar4 - iVar10) < -5) {
    pvVar6 = (this->data).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar11 = this->num_data_points;
    dVar15 = (x + 1.0) * dVar14 + -1.0 + (double)(int)(uVar4 - 5) * -0.125;
    iVar7 = -1;
    if ((ABS(dVar15) <= 1.0) && (iVar7 = 0, 2 < iVar11)) {
      iVar12 = iVar11 + -1;
      iVar7 = 0;
      do {
        iVar13 = (iVar7 + iVar12) / 2;
        if (*(double *)
             (*(long *)&(pvVar6->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data + (long)iVar13 * 8) <= dVar15) {
          iVar7 = iVar13;
          iVar13 = iVar12;
        }
        iVar12 = iVar13;
      } while (1 < iVar12 - iVar7);
    }
    if (iVar7 != -1) {
      lVar8 = (long)iVar11 * 0x28 +
              *(long *)&pvVar6[4].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data;
      if (iVar7 < 1) goto LAB_001c4b65;
      iVar12 = iVar11 + -3;
      if (iVar7 - iVar11 < -2) {
        iVar12 = iVar7;
      }
      lVar5 = (long)(iVar12 + -1);
      goto LAB_001c4b67;
    }
  }
  else {
    pvVar6 = (this->data).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar11 = this->num_data_points;
    dVar15 = (1.0 - x) * dVar14 + -1.0;
    iVar7 = -1;
    if ((ABS(dVar15) <= 1.0) && (iVar7 = 0, 2 < iVar11)) {
      iVar12 = iVar11 + -1;
      iVar7 = 0;
      do {
        iVar13 = (iVar7 + iVar12) / 2;
        if (*(double *)
             (*(long *)&(pvVar6->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data + (long)iVar13 * 8) <= dVar15) {
          iVar7 = iVar13;
          iVar13 = iVar12;
        }
        iVar12 = iVar13;
      } while (1 < iVar12 - iVar7);
    }
    if (iVar7 != -1) {
      iVar12 = (~uVar4 + iVar10) * iVar11;
      goto LAB_001c48ab;
    }
  }
  dVar15 = 0.0;
LAB_001c4c3b:
  if (-6 < (int)(uVar4 - iVar10)) {
    dVar14 = -dVar14;
  }
  return dVar14 * dVar15;
}

Assistant:

inline double RuleWavelet::eval_cubic(int point, double x) const{
    // Helps stabilize numerical errors.
    if (point == 0 and x == 0.0 and mode == 1) return 0.0;

    // Evaluates a third order wavelet at a given point x.
    double sgn = 1.0;
    if (point < 5){ // Scaling functions
        if (point == 2){ // Reflect across y-axis
            point = 1;
            sgn = -1.0;
            x = -x;
        }else if(point == 4){
            point = 3;
            sgn = -1.0;
            x = -x;
        }
        const double *phi = &(data[1][((point+1)/2) * num_data_points]);
        return (mode == 0 ? interpolate<mode>(phi, x) : sgn * interpolate<mode>(phi, x));
    }
    int l = Maths::intlog2(point - 1);

    if(l == 2){
        if (point > 6){
            // i.e. 7 or 8
            // These wavelets are reflections across the y-axis of 6 & 5, respectively
            x = -x;
            sgn = -1.0;
            point = 13 - point;
        }
        point -= 5;
        const double *phi = &data[2][point*num_data_points];
        return (mode == 0 ? interpolate<mode>(phi, x) : sgn * interpolate<mode>(phi, x));
    }else if(l == 3){
        if (point > 12){
            // i.e. 13, 14, 15, 16
            // These wavelets are reflections of 12, 11, 10, 9, respectively
            x = -x;
            sgn = -1.0;
            point = 25 - point;
        }
        point -= 9;
        const double *phi = &data[3][point*num_data_points];
        return (mode == 0 ? interpolate<mode>(phi, x) : sgn * interpolate<mode>(phi, x));
    }
    // Standard lifted wavelets.
    int subindex = (point - 1) % (1 << l);
    double scale = pow(2,l-4);
    double value;
    if (subindex < 5){
        // Left boundary wavelet.
        value = interpolate<mode>(&data[4][subindex*num_data_points], scale * (x + 1.) - 1.);
    } else if ((1 << l) - 1 - subindex < 5){
        // Right boundary wavelet.
        value = interpolate<mode>(&data[4][((1 << l) - subindex - 1)*num_data_points], scale * (1. - x) - 1.);
    } else {
        // Central wavelets.
        double shift = 0.125 * (double (subindex - 5));
        value = interpolate<mode>(&data[4][5*num_data_points], scale * (x + 1.) -1. - shift);
    }
    // Adjust for the chain rule multiplier.
    if (mode == 1) value *= ((1 << l) - 1 - subindex < 5) ? -scale : scale;

    return value;
}